

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O1

int secp256k1_jacobi64_maybe_var(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  uint len;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_trans2x2 t;
  secp256k1_modinv64_signed62 g;
  undefined8 uStack_b0;
  secp256k1_modinv64_signed62 local_a8;
  secp256k1_modinv64_trans2x2 local_78;
  secp256k1_modinv64_signed62 local_58;
  
  local_a8.v[4] = (modinfo->modulus).v[4];
  local_a8.v[0] = (modinfo->modulus).v[0];
  local_a8.v[1] = (modinfo->modulus).v[1];
  local_a8.v[2] = (modinfo->modulus).v[2];
  local_a8.v[3] = (modinfo->modulus).v[3];
  local_58.v[4] = x->v[4];
  local_58.v[0] = x->v[0];
  local_58.v[1] = x->v[1];
  local_58.v[2] = x->v[2];
  local_58.v[3] = x->v[3];
  len = 5;
  lVar17 = -1;
  iVar16 = 0;
  uVar10 = 0;
  do {
    lVar4 = 0;
    if ((local_58.v[0] | 0xc000000000000000U) != 0) {
      for (; ((local_58.v[0] | 0xc000000000000000U) >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
      }
    }
    local_78.r = 1;
    local_78.u = 1L << ((byte)lVar4 & 0x3f);
    lVar17 = lVar17 - lVar4;
    uVar10 = ((uint)((ulong)local_a8.v[0] >> 1) ^ (uint)((ulong)local_a8.v[0] >> 2)) & (uint)lVar4 ^
             uVar10;
    if (lVar4 == 0x3e) {
      local_78.q = 0;
      local_78.v = 0;
    }
    else {
      uVar8 = local_a8.v[1] << 0x3e | local_a8.v[0];
      iVar3 = 0x3e - (uint)lVar4;
      uVar9 = (ulong)(local_58.v[1] << 0x3e | local_58.v[0]) >> ((byte)lVar4 & 0x3f);
      local_78.v = 0;
      lVar4 = 0;
      do {
        iVar11 = (int)uVar8;
        iVar13 = (int)uVar9;
        bVar6 = (byte)iVar3;
        if (lVar17 < 0) {
          lVar17 = -lVar17;
          uVar10 = uVar10 ^ (uint)((uVar8 & uVar9) >> 1);
          iVar7 = (int)lVar17 + 1;
          bVar5 = (byte)iVar7;
          if (iVar3 <= iVar7) {
            bVar5 = bVar6;
          }
          uVar12 = (uint)(0xffffffffffffffff >> (-bVar5 & 0x3f)) &
                   (iVar13 * iVar13 + 0x3e) * iVar11 * iVar13 & 0x3f;
          local_78.q = local_78.u;
          uVar14 = uVar8;
          uVar8 = uVar9;
          lVar15 = local_78.r;
        }
        else {
          iVar7 = (int)lVar17 + 1;
          bVar5 = (byte)iVar7;
          if (iVar3 <= iVar7) {
            bVar5 = bVar6;
          }
          uVar12 = (uint)(0xffffffffffffffff >> (-bVar5 & 0x3f)) &
                   -(((iVar11 * 2 + 2U & 8) + iVar11) * iVar13) & 0xf;
          local_78.q = lVar4;
          uVar14 = uVar9;
          lVar4 = local_78.u;
          lVar15 = local_78.v;
          local_78.v = local_78.r;
        }
        uVar9 = (ulong)uVar12;
        uVar14 = uVar9 * uVar8 + uVar14;
        local_78.q = lVar4 * uVar9 + local_78.q;
        local_78.r = uVar9 * lVar15 + local_78.v;
        uVar9 = -1L << (bVar6 & 0x3f) | uVar14;
        lVar1 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
          }
        }
        bVar6 = (byte)lVar1;
        uVar9 = uVar14 >> (bVar6 & 0x3f);
        local_78.u = lVar4 << (bVar6 & 0x3f);
        local_78.v = lVar15 << (bVar6 & 0x3f);
        lVar17 = lVar17 - lVar1;
        uVar10 = ((uint)(uVar8 >> 1) ^ (uint)(uVar8 >> 2)) & (uint)lVar1 ^ uVar10;
        iVar3 = iVar3 - (uint)lVar1;
        lVar4 = local_78.q;
      } while (iVar3 != 0);
    }
    secp256k1_modinv64_update_fg_62_var(len,&local_a8,&local_58,&local_78);
    if (local_a8.v[0] == 1) {
      if (1 < (int)len) {
        uVar8 = 1;
        uVar9 = 0;
        do {
          uVar9 = uVar9 | local_a8.v[uVar8];
          uVar8 = uVar8 + 1;
        } while (len != uVar8);
        if (uVar9 != 0) goto LAB_0015f82c;
      }
      uStack_b0._4_4_ = 1 - (uVar10 * 2 & 2);
      bVar2 = false;
    }
    else {
LAB_0015f82c:
      lVar4 = (long)(int)len;
      uVar12 = len - 1;
      if ((lVar4 + -2 < 0 || (&uStack_b0)[lVar4] != 0) || local_58.v[lVar4 + -1] != 0) {
        uVar12 = len;
      }
      len = uVar12;
      bVar2 = true;
    }
    if (!bVar2) {
      return uStack_b0._4_4_;
    }
    iVar16 = iVar16 + 1;
    if (iVar16 == 0x19) {
      return 0;
    }
  } while( true );
}

Assistant:

static int secp256k1_jacobi64_maybe_var(const secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with f=modulus, g=x, eta=-1. */
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
    int j, len = 5;
    int64_t eta = -1; /* eta = -delta; delta is initially 1 */
    int64_t cond, fn, gn;
    int jac = 0;
    int count;

    /* The input limbs must all be non-negative. */
    VERIFY_CHECK(g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0);

    /* If x > 0, then if the loop below converges, it converges to f=g=gcd(x,modulus). Since we
     * require that gcd(x,modulus)=1 and modulus>=3, x cannot be 0. Thus, we must reach f=1 (or
     * time out). */
    VERIFY_CHECK((g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4]) != 0);

    for (count = 0; count < JACOBI64_ITERATIONS; ++count) {
        /* Compute transition matrix and new eta after 62 posdivsteps. */
        secp256k1_modinv64_trans2x2 t;
        eta = secp256k1_modinv64_posdivsteps_62_var(eta, f.v[0] | ((uint64_t)f.v[1] << 62), g.v[0] | ((uint64_t)g.v[1] << 62), &t, &jac);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */

        secp256k1_modinv64_update_fg_62_var(len, &f, &g, &t);
        /* If the bottom limb of f is 1, there is a chance that f=1. */
        if (f.v[0] == 1) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= f.v[j];
            }
            /* If so, we're done. When f=1, the Jacobi symbol (g | f)=1. */
            if (cond == 0) return 1 - 2*(jac & 1);
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int64_t)len - 2) >> 63;
        cond |= fn;
        cond |= gn;
        /* If so, reduce length. */
        if (cond == 0) --len;

        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */
    }

    /* The loop failed to converge to f=g after 1550 iterations. Return 0, indicating unknown result. */
    return 0;
}